

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowControl.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     call_far<unsigned_short,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
               (Instruction<false> *instruction,Context *context)

{
  Source SVar1;
  uint16_t segment_00;
  ImmediateT address;
  type_conflict3 address_00;
  type_conflict3 segment_01;
  uint32_t uVar2;
  uint16_t *puVar3;
  FlowController *this;
  uint16_t segment;
  uint16_t offset;
  uint16_t local_1c;
  Source local_19;
  DataPointer pointer;
  uint16_t source_address;
  Context *pCStack_18;
  Source source_segment;
  Context *context_local;
  Instruction<false> *instruction_local;
  
  pCStack_18 = context;
  local_19 = Instruction<false>::data_segment(instruction);
  PCCompatible::Memory::preauthorise_stack_write(&pCStack_18->memory,4);
  offset = (uint16_t)Instruction<false>::destination(instruction);
  SVar1 = DataPointer::source((DataPointer *)&offset);
  switch(SVar1) {
  case DirectAddress:
    uVar2 = address<(InstructionSet::x86::Source)15,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                      (instruction,(DataPointer)offset,pCStack_18);
    local_1c = (uint16_t)uVar2;
    break;
  default:
  case Immediate:
    puVar3 = PCCompatible::Registers::cs(&pCStack_18->registers);
    push<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
              (puVar3,pCStack_18);
    puVar3 = PCCompatible::Registers::ip(&pCStack_18->registers);
    push<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
              (puVar3,pCStack_18);
    this = &pCStack_18->flow_controller;
    segment_00 = Instruction<false>::segment(instruction);
    address = Instruction<false>::offset(instruction);
    PCCompatible::FlowController::jump<unsigned_short>(this,segment_00,address);
    return;
  case IndirectNoBase:
    uVar2 = address<(InstructionSet::x86::Source)23,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                      (instruction,(DataPointer)offset,pCStack_18);
    local_1c = (uint16_t)uVar2;
    break;
  case Indirect:
    uVar2 = address<(InstructionSet::x86::Source)24,unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                      (instruction,(DataPointer)offset,pCStack_18);
    local_1c = (uint16_t)uVar2;
  }
  PCCompatible::Memory::preauthorise_read(&pCStack_18->memory,local_19,local_1c,4);
  address_00 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                         (&pCStack_18->memory,local_19,local_1c);
  local_1c = local_1c + 2;
  segment_01 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                         (&pCStack_18->memory,local_19,local_1c);
  puVar3 = PCCompatible::Registers::cs(&pCStack_18->registers);
  push<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
            (puVar3,pCStack_18);
  puVar3 = PCCompatible::Registers::ip(&pCStack_18->registers);
  push<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
            (puVar3,pCStack_18);
  PCCompatible::FlowController::jump<unsigned_short>
            (&pCStack_18->flow_controller,segment_01,address_00);
  return;
}

Assistant:

void call_far(
	InstructionT &instruction,
	ContextT &context
) {
	// TODO: eliminate 16-bit assumption below.
	const Source source_segment = instruction.data_segment();
	context.memory.preauthorise_stack_write(sizeof(uint16_t) * 2);

	uint16_t source_address;
	const auto pointer = instruction.destination();
	switch(pointer.source()) {
		default:
		case Source::Immediate:
			push<uint16_t, true>(context.registers.cs(), context);
			push<uint16_t, true>(context.registers.ip(), context);
			context.flow_controller.template jump<uint16_t>(instruction.segment(), instruction.offset());
		return;

		case Source::Indirect:
			source_address = uint16_t(address<Source::Indirect, uint16_t, AccessType::Read>(instruction, pointer, context));
		break;
		case Source::IndirectNoBase:
			source_address = uint16_t(address<Source::IndirectNoBase, uint16_t, AccessType::Read>(instruction, pointer, context));
		break;
		case Source::DirectAddress:
			source_address = uint16_t(address<Source::DirectAddress, uint16_t, AccessType::Read>(instruction, pointer, context));
		break;
	}

	context.memory.preauthorise_read(source_segment, source_address, sizeof(uint16_t) * 2);
	const uint16_t offset = context.memory.template access<uint16_t, AccessType::PreauthorisedRead>(source_segment, source_address);
	source_address += 2;
	const uint16_t segment = context.memory.template access<uint16_t, AccessType::PreauthorisedRead>(source_segment, source_address);

	// At least on an 8086, the stack writes occur after the target address read.
	push<uint16_t, true>(context.registers.cs(), context);
	push<uint16_t, true>(context.registers.ip(), context);

	context.flow_controller.template jump<AddressT>(segment, offset);
}